

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::clara::detail::Opt::isMatch(Opt *this,string *optToken)

{
  pointer pbVar1;
  pointer pbVar2;
  __type _Var3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  string normalisedToken;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ::std::__cxx11::string::string((string *)&bStack_68,(string *)optToken);
  pbVar1 = (this->m_optNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (this->m_optNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    pbVar4 = pbVar2;
    if (pbVar4 == pbVar1) break;
    ::std::__cxx11::string::string((string *)&local_48,(string *)pbVar4);
    _Var3 = ::std::operator==(&local_48,&bStack_68);
    ::std::__cxx11::string::~string((string *)&local_48);
    pbVar2 = pbVar4 + 1;
  } while (!_Var3);
  ::std::__cxx11::string::~string((string *)&bStack_68);
  return pbVar4 != pbVar1;
}

Assistant:

auto isMatch( std::string const &optToken ) const -> bool {
            auto normalisedToken = normaliseOpt( optToken );
            for( auto const &name : m_optNames ) {
                if( normaliseOpt( name ) == normalisedToken )
                    return true;
            }
            return false;
        }